

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

int PystringSet_Convert(PyObject *py_strings,xmlChar ***result)

{
  bool bVar1;
  int iVar2;
  xmlChar **__s;
  xmlChar *pxVar3;
  PyTypeObject *local_50;
  int local_48;
  char *s;
  int idx;
  int init_index;
  int count;
  int is_tuple;
  xmlChar **strings;
  xmlChar ***result_local;
  PyObject *py_strings_local;
  
  s._4_4_ = 0;
  iVar2 = PyType_HasFeature(py_strings->ob_type,0x4000000);
  if (iVar2 == 0) {
    iVar2 = PyType_HasFeature(py_strings->ob_type,0x2000000);
    if (iVar2 == 0) {
      if (py_strings == (PyObject *)&_Py_NoneStruct) {
        *result = (xmlChar **)0x0;
        return 0;
      }
      PyErr_SetString(_PyExc_TypeError,"must be a tuple or list of strings.");
      return -1;
    }
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    iVar2 = PyType_HasFeature(py_strings->ob_type,0x4000000);
    if (iVar2 == 0) {
      __assert_fail("PyTuple_Check(py_strings)",
                    "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                    ,0xcd5,"int PystringSet_Convert(PyObject *, xmlChar ***)");
    }
    local_48 = (int)py_strings[1].ob_refcnt;
  }
  else {
    iVar2 = PyType_HasFeature(py_strings->ob_type,0x2000000);
    if (iVar2 == 0) {
      __assert_fail("PyList_Check(py_strings)",
                    "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                    ,0xcd6,"int PystringSet_Convert(PyObject *, xmlChar ***)");
    }
    local_48 = (int)py_strings[1].ob_refcnt;
  }
  __s = (xmlChar **)(*_xmlMalloc)((long)local_48 << 3);
  if (__s == (xmlChar **)0x0) {
    PyErr_SetString(_PyExc_MemoryError,"");
    py_strings_local._4_4_ = -1;
  }
  else {
    memset(__s,0,(long)local_48 << 3);
    for (s._0_4_ = 0; (int)s < local_48; s._0_4_ = (int)s + 1) {
      if (bVar1) {
        iVar2 = PyType_HasFeature(py_strings->ob_type,0x4000000);
        if (iVar2 == 0) {
          __assert_fail("PyTuple_Check(py_strings)",
                        "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                        ,0xce6,"int PystringSet_Convert(PyObject *, xmlChar ***)");
        }
        local_50 = (&py_strings[1].ob_type)[(int)s];
      }
      else {
        iVar2 = PyType_HasFeature(py_strings->ob_type,0x2000000);
        if (iVar2 == 0) {
          __assert_fail("PyList_Check(py_strings)",
                        "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                        ,0xce7,"int PystringSet_Convert(PyObject *, xmlChar ***)");
        }
        local_50 = (PyTypeObject *)(&((py_strings[1].ob_type)->ob_base).ob_base.ob_refcnt)[(int)s];
      }
      pxVar3 = (xmlChar *)PyBytes_AsString(local_50);
      if (pxVar3 == (xmlChar *)0x0) {
        (*_xmlFree)(__s);
        PyErr_SetString(_PyExc_TypeError,"must be a tuple or list of strings.");
        return -1;
      }
      __s[s._4_4_] = pxVar3;
      s._4_4_ = s._4_4_ + 1;
    }
    *result = __s;
    py_strings_local._4_4_ = 0;
  }
  return py_strings_local._4_4_;
}

Assistant:

static int
PystringSet_Convert(PyObject *py_strings, xmlChar *** result)
{
    /* NOTE: the array should be freed, but the strings are shared
       with the python strings and so must not be freed. */

    xmlChar ** strings;
    int is_tuple = 0;
    int count;
    int init_index = 0;

    if (PyTuple_Check(py_strings))
        is_tuple = 1;
    else if (PyList_Check(py_strings))
        is_tuple = 0;
    else if (py_strings == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of strings.");
        return -1;
    }

    count = (is_tuple
             ? PyTuple_GET_SIZE(py_strings)
             : PyList_GET_SIZE(py_strings));

    strings = (xmlChar **) xmlMalloc(sizeof(xmlChar *) * count);

    if (strings == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    memset(strings, 0 , sizeof(xmlChar *) * count);

    {
        int idx;
        for (idx=0; idx < count; ++idx) {
            char* s = PyBytes_AsString
                (is_tuple
                 ? PyTuple_GET_ITEM(py_strings, idx)
                 : PyList_GET_ITEM(py_strings, idx));
            if (s)
                strings[init_index++] = (xmlChar *)s;
            else {
                xmlFree(strings);
                PyErr_SetString(PyExc_TypeError,
                                "must be a tuple or list of strings.");
                return -1;
            }
        }
    }

    *result = strings;
    return 0;
}